

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::rc::Texture2D::sample4(Texture2D *this,Vec4 *output,Vec2 *packetTexcoords,float lodBias)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  Vec2 *local_98;
  Vector<float,_2> *local_90;
  undefined1 local_80 [24];
  float lod;
  float p;
  float mv;
  float mu;
  Vec2 *dFdy;
  Vec2 *dFdx;
  int fragNdx;
  Vec2 dFdy1;
  Vec2 dFdy0;
  Vec2 dFdx1;
  Vec2 dFdx0;
  float texHeight;
  float texWidth;
  float lodBias_local;
  Vec2 *packetTexcoords_local;
  Vec4 *output_local;
  Texture2D *this_local;
  
  iVar1 = tcu::Texture2DView::getWidth(&this->m_view);
  iVar2 = tcu::Texture2DView::getHeight(&this->m_view);
  tcu::operator-((tcu *)&dFdx1,packetTexcoords + 1,packetTexcoords);
  tcu::operator-((tcu *)&dFdy0,packetTexcoords + 3,packetTexcoords + 2);
  tcu::operator-((tcu *)&dFdy1,packetTexcoords + 2,packetTexcoords);
  tcu::operator-((tcu *)((long)&dFdx + 4),packetTexcoords + 3,packetTexcoords + 1);
  for (dFdx._0_4_ = 0; (int)(uint)dFdx < 4; dFdx._0_4_ = (uint)dFdx + 1) {
    if (((uint)dFdx & 2) == 0) {
      local_90 = &dFdx1;
    }
    else {
      local_90 = &dFdy0;
    }
    dFdy = local_90;
    if (((uint)dFdx & 1) == 0) {
      local_98 = &dFdy1;
    }
    else {
      local_98 = (Vec2 *)((long)&dFdx + 4);
    }
    _mv = local_98;
    fVar3 = tcu::Vector<float,_2>::x(local_90);
    fVar3 = de::abs<float>(fVar3);
    fVar4 = tcu::Vector<float,_2>::x(_mv);
    fVar4 = de::abs<float>(fVar4);
    p = de::max<float>(fVar3,fVar4);
    fVar3 = tcu::Vector<float,_2>::y(dFdy);
    fVar3 = de::abs<float>(fVar3);
    fVar4 = tcu::Vector<float,_2>::y(_mv);
    fVar4 = de::abs<float>(fVar4);
    lod = de::max<float>(fVar3,fVar4);
    local_80._20_4_ = de::max<float>(p * (float)iVar1,lod * (float)iVar2);
    local_80._16_4_ = deFloatLog2((float)local_80._20_4_);
    local_80._16_4_ = (float)local_80._16_4_ + lodBias;
    fVar3 = tcu::Vector<float,_2>::x(packetTexcoords + (int)(uint)dFdx);
    fVar4 = tcu::Vector<float,_2>::y(packetTexcoords + (int)(uint)dFdx);
    sample((Texture2D *)local_80,fVar3,fVar4,(float)local_80._16_4_);
    *(undefined8 *)output[(int)(uint)dFdx].m_data = local_80._0_8_;
    *(undefined8 *)(output[(int)(uint)dFdx].m_data + 2) = local_80._8_8_;
  }
  return;
}

Assistant:

void Texture2D::sample4 (tcu::Vec4 output[4], const tcu::Vec2 packetTexcoords[4], float lodBias) const
{
	const float texWidth  = (float)m_view.getWidth();
	const float texHeight = (float)m_view.getHeight();

	const tcu::Vec2 dFdx0 = packetTexcoords[1] - packetTexcoords[0];
	const tcu::Vec2 dFdx1 = packetTexcoords[3] - packetTexcoords[2];
	const tcu::Vec2 dFdy0 = packetTexcoords[2] - packetTexcoords[0];
	const tcu::Vec2 dFdy1 = packetTexcoords[3] - packetTexcoords[1];

	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::Vec2& dFdx = (fragNdx & 2) ? dFdx1 : dFdx0;
		const tcu::Vec2& dFdy = (fragNdx & 1) ? dFdy1 : dFdy0;

		const float mu = de::max(de::abs(dFdx.x()), de::abs(dFdy.x()));
		const float mv = de::max(de::abs(dFdx.y()), de::abs(dFdy.y()));
		const float p = de::max(mu * texWidth, mv * texHeight);

		const float	lod = deFloatLog2(p) + lodBias;

		output[fragNdx] = sample(packetTexcoords[fragNdx].x(), packetTexcoords[fragNdx].y(), lod);
	}
}